

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O1

bool __thiscall leveldb::anon_unknown_3::DBIter::ParseKey(DBIter *this,ParsedInternalKey *ikey)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  char *pcVar3;
  uint uVar4;
  ValueType VVar5;
  ulong uVar6;
  uint uVar7;
  ulong extraout_RDX;
  long extraout_RDX_00;
  bool bVar8;
  Slice key;
  Status local_50;
  Slice local_48;
  Slice local_38;
  
  iVar1 = (*this->iter_->_vptr_Iterator[8])();
  pcVar3 = (char *)CONCAT44(extraout_var,iVar1);
  (*this->iter_->_vptr_Iterator[9])();
  lVar2 = this->bytes_counter_ - (extraout_RDX_00 + extraout_RDX);
  this->bytes_counter_ = lVar2;
  while (lVar2 < 0) {
    uVar6 = (ulong)(this->rnd_).seed_ * 0x41a7;
    uVar4 = (uint)uVar6 & 0x7fffffff;
    iVar1 = (int)(uVar6 >> 0x1f);
    uVar7 = iVar1 + uVar4;
    uVar4 = iVar1 + uVar4 + 0x80000001;
    if (-1 < (int)uVar7) {
      uVar4 = uVar7;
    }
    (this->rnd_).seed_ = uVar4;
    this->bytes_counter_ = (ulong)(uVar4 & 0x1fffff) + lVar2;
    key.size_ = extraout_RDX;
    key.data_ = pcVar3;
    DBImpl::RecordReadSample(this->db_,key);
    lVar2 = this->bytes_counter_;
  }
  if (extraout_RDX < 8) {
    bVar8 = false;
  }
  else {
    VVar5 = (ValueType)*(ulong *)(pcVar3 + (extraout_RDX - 8)) & 0xff;
    ikey->sequence = *(ulong *)(pcVar3 + (extraout_RDX - 8)) >> 8;
    ikey->type = VVar5;
    (ikey->user_key).data_ = pcVar3;
    (ikey->user_key).size_ = extraout_RDX - 8;
    bVar8 = VVar5 < 2;
  }
  if (bVar8 == false) {
    local_38.data_ = "corrupted internal key in DBIter";
    local_38.size_ = 0x20;
    local_48.data_ = "";
    local_48.size_ = 0;
    Status::Status(&local_50,kCorruption,&local_38,&local_48);
    pcVar3 = (this->status_).state_;
    if (pcVar3 != local_50.state_) {
      if (pcVar3 != (char *)0x0) {
        operator_delete__(pcVar3);
      }
      if (local_50.state_ == (char *)0x0) {
        pcVar3 = (char *)0x0;
      }
      else {
        pcVar3 = Status::CopyState(local_50.state_);
      }
      (this->status_).state_ = pcVar3;
    }
    if (local_50.state_ != (char *)0x0) {
      operator_delete__(local_50.state_);
    }
  }
  return bVar8;
}

Assistant:

inline bool DBIter::ParseKey(ParsedInternalKey *ikey) {
            Slice k = iter_->key();
            ssize_t n = k.size() + iter_->value().size();
            bytes_counter_ -= n;
            while (bytes_counter_ < 0) {
                bytes_counter_ += RandomPeriod();
                db_->RecordReadSample(k);
            }
            if (!ParseInternalKey(k, ikey)) {
                status_ = Status::Corruption("corrupted internal key in DBIter");
                return false;
            } else {
                return true;
            }
        }